

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O3

void __thiscall Socket_Connect_Test::~Socket_Connect_Test(Socket_Connect_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Socket, Connect) {
    constexpr uint16_t PORT = 27000;

    ServerSocket server(AddressFamily::IPV4);
    server.setSoLinger(false, 0);
    server.bind("0.0.0.0", PORT);

    std::thread thread([&]() {
        try {
            server.accept();
        } catch (const std::exception& ex) {
            FAIL() << ex.what() << '\n';
        }
    });

    Socket socket(AddressFamily::IPV4);
    socket.connect("127.0.0.1", PORT);
    thread.join();
}